

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PolarizableAtomTypesSectionParser.cpp
# Opt level: O0

void __thiscall
OpenMD::PolarizableAtomTypesSectionParser::parseLine
          (PolarizableAtomTypesSectionParser *this,ForceField *ff,string *line,int lineNo)

{
  int iVar1;
  AtomType *AT;
  uint in_ECX;
  RealType polarizability;
  PolarizableAdapter fca;
  AtomType *atomType;
  string atomTypeName;
  int nTokens;
  StringTokenizer tokenizer;
  errorStruct *in_stack_fffffffffffffee0;
  StringTokenizer *in_stack_fffffffffffffef0;
  string *delim;
  string *in_stack_ffffffffffffff18;
  PolarizableAdapter in_stack_ffffffffffffff20;
  PolarizableAdapter *in_stack_ffffffffffffff30;
  undefined1 local_99 [33];
  StringTokenizer *in_stack_ffffffffffffff88;
  
  delim = (string *)local_99;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffff20.at_,(char *)in_stack_ffffffffffffff18,
             (allocator<char> *)delim);
  StringTokenizer::StringTokenizer
            ((StringTokenizer *)in_stack_ffffffffffffff20.at_,in_stack_ffffffffffffff18,delim);
  std::__cxx11::string::~string((string *)(local_99 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_99);
  iVar1 = StringTokenizer::countTokens(in_stack_fffffffffffffef0);
  if (iVar1 < 2) {
    snprintf(painCave.errMsg,2000,
             "PolarizableAtomTypesSectionParser Error: Not enough tokens at line %d\n",(ulong)in_ECX
            );
    painCave.isFatal = 1;
    simError();
  }
  else {
    StringTokenizer::nextToken_abi_cxx11_(in_stack_ffffffffffffff88);
    AT = ForceField::getAtomType(in_stack_ffffffffffffff20.at_,in_stack_ffffffffffffff18);
    if (AT == (AtomType *)0x0) {
      in_stack_fffffffffffffee0 = &painCave;
      snprintf(painCave.errMsg,2000,
               "PolarizableAtomTypesSectionParser Error: Can not find matching AtomType at line %d\n"
               ,(ulong)in_ECX);
      in_stack_fffffffffffffee0->isFatal = 1;
      simError();
    }
    else {
      PolarizableAdapter::PolarizableAdapter((PolarizableAdapter *)&stack0xffffffffffffff20,AT);
      StringTokenizer::nextTokenAsDouble((StringTokenizer *)in_stack_ffffffffffffff20.at_);
      PolarizableAdapter::makePolarizable(in_stack_ffffffffffffff30,(RealType)AT);
    }
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff30);
  }
  StringTokenizer::~StringTokenizer((StringTokenizer *)in_stack_fffffffffffffee0);
  return;
}

Assistant:

void PolarizableAtomTypesSectionParser::parseLine(ForceField& ff,
                                                    const std::string& line,
                                                    int lineNo) {
    StringTokenizer tokenizer(line);
    int nTokens = tokenizer.countTokens();

    if (nTokens < 2) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "PolarizableAtomTypesSectionParser Error: "
               "Not enough tokens at line %d\n",
               lineNo);
      painCave.isFatal = 1;
      simError();
    } else {
      std::string atomTypeName = tokenizer.nextToken();

      AtomType* atomType = ff.getAtomType(atomTypeName);
      if (atomType != NULL) {
        PolarizableAdapter fca  = PolarizableAdapter(atomType);
        RealType polarizability = tokenizer.nextTokenAsDouble();
        fca.makePolarizable(polarizability);
      } else {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "PolarizableAtomTypesSectionParser Error: "
                 "Can not find matching AtomType at line %d\n",
                 lineNo);
        painCave.isFatal = 1;
        simError();
      }
    }
  }